

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# torcontrol.cpp
# Opt level: O2

void __thiscall
TorControlConnection::TorControlConnection(TorControlConnection *this,event_base *_base)

{
  long lVar1;
  long in_FS_OFFSET;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  (this->disconnected).super__Function_base._M_manager = (_Manager_type)0x0;
  (this->disconnected)._M_invoker = (_Invoker_type)0x0;
  *(undefined8 *)&(this->disconnected).super__Function_base._M_functor = 0;
  *(undefined8 *)((long)&(this->disconnected).super__Function_base._M_functor + 8) = 0;
  (this->connected).super__Function_base._M_manager = (_Manager_type)0x0;
  (this->connected)._M_invoker = (_Invoker_type)0x0;
  *(undefined8 *)&(this->connected).super__Function_base._M_functor = 0;
  *(undefined8 *)((long)&(this->connected).super__Function_base._M_functor + 8) = 0;
  this->base = _base;
  this->b_conn = (bufferevent *)0x0;
  TorControlReply::TorControlReply(&this->message);
  std::
  _Deque_base<std::function<void_(TorControlConnection_&,_const_TorControlReply_&)>,_std::allocator<std::function<void_(TorControlConnection_&,_const_TorControlReply_&)>_>_>
  ::_Deque_base(&(this->reply_handlers).
                 super__Deque_base<std::function<void_(TorControlConnection_&,_const_TorControlReply_&)>,_std::allocator<std::function<void_(TorControlConnection_&,_const_TorControlReply_&)>_>_>
               );
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

TorControlConnection::TorControlConnection(struct event_base* _base)
    : base(_base)
{
}